

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O2

void idct16_stage7_sse2(__m128i *output,__m128i *x)

{
  __m128i alVar1;
  __m128i alVar2;
  __m128i alVar3;
  
  alVar2 = *x;
  alVar1 = x[0xf];
  alVar3 = (__m128i)paddsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  *output = alVar3;
  alVar2 = (__m128i)psubsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0xf] = alVar2;
  alVar2 = x[1];
  alVar1 = x[0xe];
  alVar3 = (__m128i)paddsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[1] = alVar3;
  alVar2 = (__m128i)psubsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0xe] = alVar2;
  alVar2 = x[2];
  alVar1 = x[0xd];
  alVar3 = (__m128i)paddsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[2] = alVar3;
  alVar2 = (__m128i)psubsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0xd] = alVar2;
  alVar2 = x[3];
  alVar1 = x[0xc];
  alVar3 = (__m128i)paddsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[3] = alVar3;
  alVar2 = (__m128i)psubsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0xc] = alVar2;
  alVar2 = x[4];
  alVar1 = x[0xb];
  alVar3 = (__m128i)paddsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[4] = alVar3;
  alVar2 = (__m128i)psubsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0xb] = alVar2;
  alVar2 = x[5];
  alVar1 = x[10];
  alVar3 = (__m128i)paddsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[5] = alVar3;
  alVar2 = (__m128i)psubsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[10] = alVar2;
  alVar2 = x[6];
  alVar1 = x[9];
  alVar3 = (__m128i)paddsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[6] = alVar3;
  alVar2 = (__m128i)psubsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[9] = alVar2;
  alVar2 = x[7];
  alVar1 = x[8];
  alVar3 = (__m128i)paddsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[7] = alVar3;
  alVar2 = (__m128i)psubsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[8] = alVar2;
  return;
}

Assistant:

static inline void idct16_stage7_sse2(__m128i *output, __m128i *x) {
  btf_16_adds_subs_out_sse2(output[0], output[15], x[0], x[15]);
  btf_16_adds_subs_out_sse2(output[1], output[14], x[1], x[14]);
  btf_16_adds_subs_out_sse2(output[2], output[13], x[2], x[13]);
  btf_16_adds_subs_out_sse2(output[3], output[12], x[3], x[12]);
  btf_16_adds_subs_out_sse2(output[4], output[11], x[4], x[11]);
  btf_16_adds_subs_out_sse2(output[5], output[10], x[5], x[10]);
  btf_16_adds_subs_out_sse2(output[6], output[9], x[6], x[9]);
  btf_16_adds_subs_out_sse2(output[7], output[8], x[7], x[8]);
}